

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

RequestDsl * __thiscall RequestDsl::header(RequestDsl *this,string *name,string *value)

{
  size_type *psVar1;
  size_type *psVar2;
  pointer pcVar3;
  undefined1 local_68 [8];
  HeaderItem item;
  
  psVar1 = &item.name._M_string_length;
  pcVar3 = (name->_M_dataplus)._M_p;
  local_68 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar3,pcVar3 + name->_M_string_length);
  psVar2 = &item.value._M_string_length;
  pcVar3 = (value->_M_dataplus)._M_p;
  item.name.field_2._8_8_ = psVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&item.name.field_2 + 8),pcVar3,pcVar3 + value->_M_string_length);
  std::vector<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>::
  push_back(&(this->request).headers,(value_type *)local_68);
  if ((size_type *)item.name.field_2._8_8_ != psVar2) {
    operator_delete((void *)item.name.field_2._8_8_,item.value._M_string_length + 1);
  }
  if (local_68 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_68,item.name._M_string_length + 1);
  }
  return this;
}

Assistant:

RequestDsl &header(const std::string &name, const std::string &value)
    {
        httpparser::Request::HeaderItem item = {name, value};
        request.headers.push_back(item);
        return *this; 
    }